

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O0

bool __thiscall ZXing::BitMatrix::get(BitMatrix *this,int x,int y)

{
  data_t *pdVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  int in_stack_ffffffffffffffec;
  
  pdVar1 = get((BitMatrix *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  return *pdVar1 != '\0';
}

Assistant:

bool get(int x, int y) const { return get(y * _width + x); }